

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_pf2iw_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = float32_to_int32_round_to_zero_x86_64(s->_s_MMXReg[0],&env->mmx_status);
  if (0x7ffe < (int)uVar1) {
    uVar1 = 0x7fff;
  }
  if ((int)uVar1 < -0x7fff) {
    uVar1 = 0xffff8000;
  }
  d->_l_MMXReg[0] = uVar1;
  uVar2 = float32_to_int32_round_to_zero_x86_64(s->_s_MMXReg[1],&env->mmx_status);
  uVar1 = 0x7fff;
  if ((int)uVar2 < 0x7fff) {
    uVar1 = uVar2;
  }
  if ((int)uVar1 < -0x7fff) {
    uVar1 = 0xffff8000;
  }
  d->_l_MMXReg[1] = uVar1;
  return;
}

Assistant:

void helper_pf2iw(CPUX86State *env, MMXReg *d, MMXReg *s)
{
    d->MMX_L(0) = satsw(float32_to_int32_round_to_zero(s->MMX_S(0),
                                                       &env->mmx_status));
    d->MMX_L(1) = satsw(float32_to_int32_round_to_zero(s->MMX_S(1),
                                                       &env->mmx_status));
}